

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O2

void __thiscall
helics::CommsInterface::addRoute(CommsInterface *this,route_id rid,string_view routeInfo)

{
  string_view routeInfo_local;
  ActionMessage route;
  
  routeInfo_local._M_str = routeInfo._M_str;
  routeInfo_local._M_len = routeInfo._M_len;
  ActionMessage::ActionMessage(&route,cmd_protocol_priority);
  SmallBuffer::operator=(&route.payload,&routeInfo_local);
  route.messageID = 0xe9;
  route.dest_handle.hid = rid.rid;
  transmit(this,(route_id)0xffffffff,&route);
  ActionMessage::~ActionMessage(&route);
  return;
}

Assistant:

void CommsInterface::addRoute(route_id rid, std::string_view routeInfo)
{
    ActionMessage route(CMD_PROTOCOL_PRIORITY);
    route.payload = routeInfo;
    route.messageID = NEW_ROUTE;
    route.setExtraData(rid.baseValue());
    transmit(control_route, std::move(route));
}